

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QMainWindowLayoutState::plug(QMainWindowLayoutState *this,QList<int> *path)

{
  int iVar1;
  QLayoutItem *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    QList<int>::mid((QList<int> *)&local_30,path,1,-1);
    pQVar2 = QDockAreaLayout::plug(&this->dockAreaLayout,(QList<int> *)&local_30);
  }
  else {
    if (iVar1 != 0) {
      pQVar2 = (QLayoutItem *)0x0;
      goto LAB_00400957;
    }
    QList<int>::mid((QList<int> *)&local_30,path,1,-1);
    pQVar2 = QToolBarAreaLayout::plug(&this->toolBarAreaLayout,(QList<int> *)&local_30);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
LAB_00400957:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::plug(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        return toolBarAreaLayout.plug(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.plug(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}